

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

string * unicode_cpt_to_utf8_abi_cxx11_(string *__return_storage_ptr__,uint32_t cpt)

{
  invalid_argument *this;
  char cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = (char)__return_storage_ptr__;
  if (0x7f < cpt) {
    if (cpt < 0x800) {
      std::__cxx11::string::push_back(cVar1);
    }
    else if (cpt < 0x10000) {
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
    }
    else {
      if (0x10ffff < cpt) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"invalid codepoint");
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
      std::__cxx11::string::push_back(cVar1);
    }
  }
  std::__cxx11::string::push_back(cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string unicode_cpt_to_utf8(uint32_t cpt) {
    std::string result;

    if (/* 0x00 <= cpt && */ cpt <= 0x7f) {
        result.push_back(cpt);
        return result;
    }
    if (0x80 <= cpt && cpt <= 0x7ff) {
        result.push_back(0xc0 | ((cpt >> 6) & 0x1f));
        result.push_back(0x80 | (cpt & 0x3f));
        return result;
    }
    if (0x800 <= cpt && cpt <= 0xffff) {
        result.push_back(0xe0 | ((cpt >> 12) & 0x0f));
        result.push_back(0x80 | ((cpt >> 6) & 0x3f));
        result.push_back(0x80 | (cpt & 0x3f));
        return result;
    }
    if (0x10000 <= cpt && cpt <= 0x10ffff) {
        result.push_back(0xf0 | ((cpt >> 18) & 0x07));
        result.push_back(0x80 | ((cpt >> 12) & 0x3f));
        result.push_back(0x80 | ((cpt >> 6) & 0x3f));
        result.push_back(0x80 | (cpt & 0x3f));
        return result;
    }

    throw std::invalid_argument("invalid codepoint");
}